

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O0

FILE * srunner_open_file(char *filename)

{
  int iVar1;
  FILE *local_18;
  FILE *f;
  char *filename_local;
  
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    local_18 = _stdout;
  }
  else {
    local_18 = fopen(filename,"w");
    if (local_18 == (FILE *)0x0) {
      eprintf("Error in call to fopen while opening file %s:",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_log.c"
              ,0x1cd,filename);
    }
  }
  return (FILE *)local_18;
}

Assistant:

static FILE *srunner_open_file(const char *filename)
{
    FILE *f = NULL;

    if(strcmp(filename, STDOUT_OVERRIDE_LOG_FILE_NAME) == 0)
    {
        f = stdout;
    }
    else
    {
        f = fopen(filename, "w");
        if(f == NULL)
        {
            eprintf("Error in call to fopen while opening file %s:", __FILE__,
                    __LINE__ - 2, filename);
        }
    }
    return f;
}